

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

bool xercesc_4_0::XMLUri::isURIString(XMLCh *uricString)

{
  XMLCh *pXVar1;
  bool bVar2;
  XMLCh theChar;
  XMLSize_t XVar3;
  long lVar4;
  bool bVar5;
  
  if ((uricString == (XMLCh *)0x0) || (theChar = *uricString, theChar == L'\0')) {
    bVar5 = false;
  }
  else {
    while (bVar5 = theChar == L'\0', !bVar5) {
      bVar2 = isReservedOrUnreservedCharacter(theChar);
      lVar4 = 2;
      if (!bVar2) {
        if (*uricString != L'%') {
          return bVar5;
        }
        XVar3 = XMLString::stringLen(uricString);
        if (XVar3 < 3) {
          return bVar5;
        }
        bVar2 = XMLString::isHex(uricString[1]);
        if (!bVar2) {
          return bVar5;
        }
        bVar2 = XMLString::isHex(uricString[2]);
        lVar4 = 6;
        if (!bVar2) {
          return bVar5;
        }
      }
      pXVar1 = (XMLCh *)((long)uricString + lVar4);
      uricString = (XMLCh *)((long)uricString + lVar4);
      theChar = *pXVar1;
    }
  }
  return bVar5;
}

Assistant:

bool XMLUri::isURIString(const XMLCh* const uricString)
{
	if (!uricString || !*uricString)
        return false;

    const XMLCh* tmpStr = uricString;

    while (*tmpStr)
    {
        if (isReservedOrUnreservedCharacter(*tmpStr))
        {
            tmpStr++;
        }
        else if (*tmpStr == chPercent)               // '%'
        {
            if (XMLString::stringLen(tmpStr) >=3
                && XMLString::isHex(*(tmpStr+1))     // 1st hex
                && XMLString::isHex(*(tmpStr+2))  )  // 2nd hex
            {
                tmpStr+=3;
            }
            else
            {
                return false;
            }
        }
        else
        {
            return false;
        }
    }

    return true;
}